

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

void predict_or_learn_adaptive<true>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i_1;
  int iVar4;
  pointer pfVar5;
  long lVar6;
  ulong uVar7;
  int i;
  size_t i_00;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_74;
  float local_70;
  
  fVar1 = ec->weight;
  iVar4 = o->t + 1;
  fVar8 = (float)iVar4;
  o->t = iVar4;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar9 = merand48(&o->all->random_state);
  i_00 = 0;
  fVar13 = 0.0;
  fVar14 = 0.0;
  local_74 = 0.0;
  local_70 = 0.0;
  fVar16 = 0.0;
  while( true ) {
    uVar7 = (ulong)o->N;
    if ((long)uVar7 <= (long)i_00) break;
    fVar10 = expf(local_74);
    ec->weight = (1.0 / (fVar10 + 1.0)) * fVar1;
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    fVar10 = (ec->l).simple.label;
    fVar12 = (ec->pred).scalar;
    pfVar5 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar2 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[i_00];
    fVar15 = fVar12 * fVar2;
    local_70 = local_70 + fVar15;
    fVar3 = pfVar5[i_00];
    fVar11 = fVar3;
    if (fVar10 * local_70 < 0.0) {
      pfVar5[i_00] = fVar3 * 0.36788;
      fVar11 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[i_00];
    }
    fVar10 = fVar10 * fVar12;
    local_74 = local_74 + fVar2 * fVar10;
    fVar12 = expf(local_74);
    pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5[i_00] = (fVar10 * (4.0 / fVar8)) / (fVar12 + 1.0) + pfVar5[i_00];
    pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar10 = pfVar5[i_00];
    if (2.0 < fVar10) {
      pfVar5[i_00] = 2.0;
      pfVar5 = (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar10 = pfVar5[i_00];
    }
    if (fVar10 < -2.0) {
      pfVar5[i_00] = -2.0;
    }
    fVar16 = (float)(-(uint)(fVar9 < fVar13) & (uint)fVar16 |
                    ~-(uint)(fVar9 < fVar13) & (uint)(fVar15 + fVar16));
    fVar13 = fVar13 + fVar3;
    fVar14 = fVar14 + fVar11;
    LEARNER::learner<char,_example>::learn(base,ec,i_00);
    i_00 = i_00 + 1;
  }
  for (lVar6 = 0; lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      pfVar5 = (o->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar5[lVar6] = pfVar5[lVar6] / fVar14;
      uVar7 = (ulong)(uint)o->N;
    }
  }
  ec->weight = fVar1;
  ec->partial_prediction = fVar16;
  fVar8 = *(float *)(&DAT_0023baf8 + (ulong)(0.0 < fVar16) * 4);
  (ec->pred).scalar = fVar8;
  ec->loss = (float)(~-(uint)(fVar8 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn_adaptive(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0, partial_prediction = 0;

  float s = 0;
  float v_normalization = 0, v_partial_sum = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / (float)sqrtf((float)o.t);

  float stopping_point = merand48(o.all->random_state);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;

      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }

      partial_prediction += ec.pred.scalar * o.alpha[i];

      v_partial_sum += o.v[i];

      // update v, exp(-1) = 0.36788
      if (ld.label * partial_prediction < 0)
      {
        o.v[i] *= 0.36788f;
      }
      v_normalization += o.v[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      if (v_partial_sum <= stopping_point)
      {
        final_prediction += ec.pred.scalar * o.alpha[i];
      }
      else
      {
        // stopping at learner i
        break;
      }
      v_partial_sum += o.v[i];
    }
  }

  // normalize v vector in training
  if (is_learn)
  {
    for (int i = 0; i < o.N; i++)
    {
      if (v_normalization)
        o.v[i] /= v_normalization;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}